

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  uint uVar1;
  int i;
  bool bVar2;
  int iVar3;
  ImGuiPopupData *pIVar4;
  int i_00;
  int n;
  ImVector<ImGuiPopupData> *this;
  
  iVar3 = (GImGui->OpenPopupStack).Size;
  if (iVar3 != 0) {
    if (ref_window == (ImGuiWindow *)0x0) {
      i_00 = 0;
    }
    else {
      this = &GImGui->OpenPopupStack;
      for (i_00 = 0; i_00 < iVar3; i_00 = i_00 + 1) {
        pIVar4 = ImVector<ImGuiPopupData>::operator[](this,i_00);
        if (pIVar4->Window != (ImGuiWindow *)0x0) {
          uVar1 = pIVar4->Window->Flags;
          if ((uVar1 >> 0x1a & 1) == 0) {
            __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                          ,0x262e,"void ImGui::ClosePopupsOverWindow(ImGuiWindow *, bool)");
          }
          i = i_00;
          if ((uVar1 >> 0x18 & 1) == 0) {
            while( true ) {
              iVar3 = this->Size;
              if (iVar3 <= i) goto LAB_001449a5;
              pIVar4 = ImVector<ImGuiPopupData>::operator[](this,i);
              if ((pIVar4->Window != (ImGuiWindow *)0x0) &&
                 (bVar2 = IsWindowWithinBeginStackOf(ref_window,pIVar4->Window), bVar2)) break;
              i = i + 1;
            }
          }
        }
        iVar3 = this->Size;
      }
    }
LAB_001449a5:
    if (i_00 < iVar3) {
      ClosePopupToLevel(i_00,restore_focus_to_window_under_popup);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size == 0)
        return;

    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack unless the popup is a direct parent of the reference window (the reference window is often the NavWindow)
            // - With this stack of window, clicking/focusing Popup1 will close Popup2 and Popup3:
            //     Window -> Popup1 -> Popup2 -> Popup3
            // - Each popups may contain child windows, which is why we compare ->RootWindowDockTree!
            //     Window -> Popup1 -> Popup1_Child -> Popup2 -> Popup2_Child
            bool ref_window_is_descendent_of_popup = false;
            for (int n = popup_count_to_keep; n < g.OpenPopupStack.Size; n++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[n].Window)
                    //if (popup_window->RootWindowDockTree == ref_window->RootWindowDockTree) // FIXME-MERGE
                    if (IsWindowWithinBeginStackOf(ref_window, popup_window))
                    {
                        ref_window_is_descendent_of_popup = true;
                        break;
                    }
            if (!ref_window_is_descendent_of_popup)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        IMGUI_DEBUG_LOG_POPUP("ClosePopupsOverWindow(\"%s\") -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}